

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

bool __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>::insert_media
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *this,Media *media)

{
  pointer puVar1;
  SCC *this_00;
  value_type *this_01;
  bool bVar2;
  __shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_02;
  element_type *this_03;
  vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
  *this_04;
  unsigned_long *puVar3;
  __shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2> *this_05;
  element_type *peVar4;
  HandledSlot *pHVar5;
  const_reference pvVar6;
  DiskROM *this_06;
  uint8_t *local_e8;
  shared_ptr<Storage::Disk::Disk> local_c0;
  reference local_b0;
  shared_ptr<Storage::Disk::Disk> *disk;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  *__range4;
  size_t drive;
  DiskROM *handler;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  uint8_t *local_40;
  Cartridge *msx_cartridge;
  uint8_t *local_30;
  SCC *local_28;
  MemorySlot *slot;
  value_type *segment;
  Media *media_local;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *this_local;
  
  segment = (value_type *)media;
  media_local = (Media *)this;
  bVar2 = std::
          vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
          ::empty(&media->cartridges);
  if (!bVar2) {
    this_02 = (__shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                 ::front((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                          *)&segment[1].end_address);
    this_03 = std::
              __shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_02);
    this_04 = Storage::Cartridge::Cartridge::get_segments(this_03);
    slot = (MemorySlot *)
           std::
           vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
           ::front(this_04);
    local_28 = (SCC *)cartridge_slot(this);
    MemorySlot::set_source
              ((MemorySlot *)local_28,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(slot->source_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = local_28;
    puVar1 = (slot->source_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_30 = (uint8_t *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &(slot->source_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    msx_cartridge =
         (Cartridge *)
         (0x10000 -
         (long)(slot->source_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    puVar3 = std::min<unsigned_long>((unsigned_long *)&local_30,(unsigned_long *)&msx_cartridge);
    MemorySlot::map<(MSX::MemorySlot::AccessType)0>
              ((MemorySlot *)this_00,0,(uint16_t)puVar1,*puVar3);
    this_05 = &std::
               vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
               ::front((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                        *)&segment[1].end_address)->
               super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>::get
                       (this_05);
    if (peVar4 == (element_type *)0x0) {
      local_e8 = (uint8_t *)0x0;
    }
    else {
      local_e8 = (uint8_t *)
                 __dynamic_cast(peVar4,&Storage::Cartridge::Cartridge::typeinfo,
                                &Analyser::Static::MSX::Cartridge::typeinfo,0);
    }
    local_40 = local_e8;
    if (local_e8 != (uint8_t *)0x0) {
      switch(*(undefined4 *)(local_e8 + 0x20)) {
      case 1:
        std::make_unique<MSX::Cartridge::KonamiROMSlotHandler,MSX::MemorySlot&>
                  ((MemorySlot *)(local_60 + 0x18));
        pHVar5 = cartridge_primary(this);
        std::unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>>::
        operator=((unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>> *)
                  &pHVar5->handler,
                  (unique_ptr<MSX::Cartridge::KonamiROMSlotHandler,_std::default_delete<MSX::Cartridge::KonamiROMSlotHandler>_>
                   *)(local_60 + 0x18));
        std::
        unique_ptr<MSX::Cartridge::KonamiROMSlotHandler,_std::default_delete<MSX::Cartridge::KonamiROMSlotHandler>_>
        ::~unique_ptr((unique_ptr<MSX::Cartridge::KonamiROMSlotHandler,_std::default_delete<MSX::Cartridge::KonamiROMSlotHandler>_>
                       *)(local_60 + 0x18));
        break;
      case 2:
        std::make_unique<MSX::Cartridge::KonamiWithSCCROMSlotHandler,MSX::MemorySlot&,Konami::SCC&>
                  ((MemorySlot *)local_60,local_28);
        pHVar5 = cartridge_primary(this);
        std::unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>>::
        operator=((unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>> *)
                  &pHVar5->handler,
                  (unique_ptr<MSX::Cartridge::KonamiWithSCCROMSlotHandler,_std::default_delete<MSX::Cartridge::KonamiWithSCCROMSlotHandler>_>
                   *)local_60);
        std::
        unique_ptr<MSX::Cartridge::KonamiWithSCCROMSlotHandler,_std::default_delete<MSX::Cartridge::KonamiWithSCCROMSlotHandler>_>
        ::~unique_ptr((unique_ptr<MSX::Cartridge::KonamiWithSCCROMSlotHandler,_std::default_delete<MSX::Cartridge::KonamiWithSCCROMSlotHandler>_>
                       *)local_60);
        break;
      case 3:
        std::make_unique<MSX::Cartridge::ASCII8kbROMSlotHandler,MSX::MemorySlot&>
                  ((MemorySlot *)(local_70 + 8));
        pHVar5 = cartridge_primary(this);
        std::unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>>::
        operator=((unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>> *)
                  &pHVar5->handler,
                  (unique_ptr<MSX::Cartridge::ASCII8kbROMSlotHandler,_std::default_delete<MSX::Cartridge::ASCII8kbROMSlotHandler>_>
                   *)(local_70 + 8));
        std::
        unique_ptr<MSX::Cartridge::ASCII8kbROMSlotHandler,_std::default_delete<MSX::Cartridge::ASCII8kbROMSlotHandler>_>
        ::~unique_ptr((unique_ptr<MSX::Cartridge::ASCII8kbROMSlotHandler,_std::default_delete<MSX::Cartridge::ASCII8kbROMSlotHandler>_>
                       *)(local_70 + 8));
        break;
      case 4:
        std::make_unique<MSX::Cartridge::ASCII16kbROMSlotHandler,MSX::MemorySlot&>
                  ((MemorySlot *)local_70);
        pHVar5 = cartridge_primary(this);
        std::unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>>::
        operator=((unique_ptr<MSX::MemorySlotHandler,std::default_delete<MSX::MemorySlotHandler>> *)
                  &pHVar5->handler,
                  (unique_ptr<MSX::Cartridge::ASCII16kbROMSlotHandler,_std::default_delete<MSX::Cartridge::ASCII16kbROMSlotHandler>_>
                   *)local_70);
        std::
        unique_ptr<MSX::Cartridge::ASCII16kbROMSlotHandler,_std::default_delete<MSX::Cartridge::ASCII16kbROMSlotHandler>_>
        ::~unique_ptr((unique_ptr<MSX::Cartridge::ASCII16kbROMSlotHandler,_std::default_delete<MSX::Cartridge::ASCII16kbROMSlotHandler>_>
                       *)local_70);
      }
    }
  }
  bVar2 = std::
          vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ::empty((vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                   *)&(segment->data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (!bVar2) {
    pvVar6 = std::
             vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ::front((vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                      *)&(segment->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    std::shared_ptr<Storage::Tape::Tape>::shared_ptr
              ((shared_ptr<Storage::Tape::Tape> *)&handler,pvVar6);
    Storage::Tape::TapePlayer::set_tape
              (&(this->tape_player_).super_TapePlayer,(shared_ptr<Storage::Tape::Tape> *)&handler);
    std::shared_ptr<Storage::Tape::Tape>::~shared_ptr((shared_ptr<Storage::Tape::Tape> *)&handler);
  }
  bVar2 = std::
          vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
          ::empty((vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                   *)segment);
  if ((!bVar2) && (this_06 = disk_handler(this), this_01 = segment, this_06 != (DiskROM *)0x0)) {
    __range4 = (vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                *)0x0;
    __end4 = std::
             vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ::begin((vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                      *)segment);
    disk = (shared_ptr<Storage::Disk::Disk> *)
           std::
           vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ::end((vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                  *)this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_std::shared_ptr<Storage::Disk::Disk>_*,_std::vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>_>
                                       *)&disk), bVar2) {
      local_b0 = __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<Storage::Disk::Disk>_*,_std::vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>_>
                 ::operator*(&__end4);
      std::shared_ptr<Storage::Disk::Disk>::shared_ptr(&local_c0,local_b0);
      DiskROM::set_disk(this_06,&local_c0,(size_t)__range4);
      std::shared_ptr<Storage::Disk::Disk>::~shared_ptr(&local_c0);
      __range4 = (vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                  *)((long)&(__range4->
                            super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
      if (__range4 ==
          (vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           *)0x2) break;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Storage::Disk::Disk>_*,_std::vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>_>
      ::operator++(&__end4);
    }
  }
  set_use_fast_tape(this);
  return true;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.cartridges.empty()) {
				const auto &segment = media.cartridges.front()->get_segments().front();
				auto &slot = cartridge_slot();

				slot.set_source(segment.data);
				slot.map(0, uint16_t(segment.start_address), std::min(segment.data.size(), 65536 - segment.start_address));

				auto msx_cartridge = dynamic_cast<Analyser::Static::MSX::Cartridge *>(media.cartridges.front().get());
				if(msx_cartridge) {
					switch(msx_cartridge->type) {
						default: break;
						case Analyser::Static::MSX::Cartridge::Konami:
							cartridge_primary().handler = std::make_unique<Cartridge::KonamiROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
						case Analyser::Static::MSX::Cartridge::KonamiWithSCC:
							cartridge_primary().handler = std::make_unique<Cartridge::KonamiWithSCCROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot), speaker_.scc);
						break;
						case Analyser::Static::MSX::Cartridge::ASCII8kb:
							cartridge_primary().handler = std::make_unique<Cartridge::ASCII8kbROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
						case Analyser::Static::MSX::Cartridge::ASCII16kb:
							cartridge_primary().handler = std::make_unique<Cartridge::ASCII16kbROMSlotHandler>(static_cast<MSX::MemorySlot &>(slot));
						break;
					}
				}
			}

			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
			}

			if(!media.disks.empty()) {
				DiskROM *const handler = disk_handler();
				if(handler) {
					size_t drive = 0;
					for(auto &disk : media.disks) {
						handler->set_disk(disk, drive);
						drive++;
						if(drive == 2) break;
					}
				}
			}

			set_use_fast_tape();

			return true;
		}